

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  vec<Minisat::Option_*> *pvVar3;
  FILE *pFVar4;
  char *pcVar5;
  char *pcVar6;
  Lit *pLVar7;
  long lVar8;
  pointer pcVar9;
  char *pcVar10;
  int __status;
  ushort in_FPUControlWord;
  double dVar11;
  vec<Minisat::Lit> dummy;
  fpu_control_t newcw;
  fpu_control_t oldcw;
  IntOption cpu_lim;
  BoolOption drup;
  BoolOption s_model;
  BoolOption pre;
  IntOption mem_lim;
  IntOption verb;
  StringOption drup_file;
  StringOption pcs_file;
  SimpSolver S;
  int local_179c;
  undefined1 local_1798 [8];
  Lit *pLStack_1790;
  ushort local_1784;
  double local_1780;
  Option local_1778;
  undefined8 local_1748;
  undefined8 local_1740;
  Option local_1738;
  long *local_1708;
  undefined8 uStack_1700;
  Option local_16f8;
  undefined2 local_16c8;
  Option local_16c0;
  undefined2 local_1690;
  Option local_1688;
  undefined2 local_1658;
  Option local_1650;
  undefined8 local_1620;
  undefined8 local_1618;
  Option local_1610;
  undefined8 local_15e0;
  undefined8 local_15d8;
  StringOption local_15d0;
  StringOption local_1590;
  Option *local_1550;
  long local_1548;
  FILE *local_1528;
  int local_151c;
  char local_1328;
  uint local_1318;
  uint local_11d8;
  vec<Minisat::Lit> local_1190 [259];
  undefined1 local_157;
  
  local_179c = argc;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  puts("c This is MergeSAT (simp).");
  local_1784 = in_FPUControlWord & 0xfcff | 0x200;
  puts("c WARNING: for repeatability, setting FPU to use double precision");
  local_1610._vptr_Option = (_func_int **)&PTR__Option_00111c00;
  local_1610.name = "verb";
  local_1610.description = "Verbosity level (0=silent, 1=some, 2=more).";
  local_1610.category = "MAIN";
  local_1610.type_name = "<int32>";
  local_1610.dependOnNonDefaultOf = (Option *)0x0;
  pvVar3 = Minisat::Option::getOptionList();
  local_1550 = &local_1610;
  Minisat::vec<Minisat::Option_*>::push(pvVar3,&local_1550);
  local_1610._vptr_Option = (_func_int **)&PTR__Option_00111b68;
  local_15e0 = 0x400000000;
  local_15d8 = 0x100000001;
  local_1688._vptr_Option = (_func_int **)&PTR__Option_00111c00;
  local_1688.name = "pre";
  local_1688.description = "Completely turn on/off any preprocessing.";
  local_1688.category = "MAIN";
  local_1688.type_name = "<bool>";
  local_1688.dependOnNonDefaultOf = (Option *)0x0;
  pvVar3 = Minisat::Option::getOptionList();
  local_1550 = &local_1688;
  Minisat::vec<Minisat::Option_*>::push(pvVar3,&local_1550);
  local_1688._vptr_Option = (_func_int **)&PTR__Option_00111c70;
  local_1658 = 0x101;
  local_16c0._vptr_Option = (_func_int **)&PTR__Option_00111c00;
  local_16c0.name = "model";
  local_16c0.description = "Do report a model if the formula is satisfiable.";
  local_16c0.category = "MAIN";
  local_16c0.type_name = "<bool>";
  local_16c0.dependOnNonDefaultOf = (Option *)0x0;
  pvVar3 = Minisat::Option::getOptionList();
  local_1550 = &local_16c0;
  Minisat::vec<Minisat::Option_*>::push(pvVar3,&local_1550);
  local_16c0._vptr_Option = (_func_int **)&PTR__Option_00111c70;
  local_1690 = 0x101;
  local_1738._vptr_Option = (_func_int **)&PTR__Option_00111c00;
  local_1738.name = "dimacs";
  local_1738.description = "If given, stop after preprocessing and write the result to this file.";
  local_1738.category = "MAIN";
  local_1738.type_name = "<std::string>";
  local_1738.dependOnNonDefaultOf = (Option *)0x0;
  pvVar3 = Minisat::Option::getOptionList();
  local_1550 = &local_1738;
  Minisat::vec<Minisat::Option_*>::push(pvVar3,&local_1550);
  local_1738._vptr_Option = (_func_int **)&PTR__StringOption_00111cf8;
  local_1708 = (long *)0x0;
  uStack_1700 = 0;
  local_1778._vptr_Option = (_func_int **)&PTR__Option_00111c00;
  local_1778.name = "cpu-lim";
  local_1778.description = "Limit on CPU time allowed in seconds.\n";
  local_1778.category = "MAIN";
  local_1778.type_name = "<int32>";
  local_1778.dependOnNonDefaultOf = (Option *)0x0;
  pvVar3 = Minisat::Option::getOptionList();
  local_1550 = &local_1778;
  Minisat::vec<Minisat::Option_*>::push(pvVar3,&local_1550);
  local_1778._vptr_Option = (_func_int **)&PTR__Option_00111b68;
  local_1748 = 0x7fffffff00000000;
  local_1740 = 0x7fffffff7fffffff;
  local_1650._vptr_Option = (_func_int **)&PTR__Option_00111c00;
  local_1650.name = "mem-lim";
  local_1650.description = "Limit on memory usage in megabytes.\n";
  local_1650.category = "MAIN";
  local_1650.type_name = "<int32>";
  local_1650.dependOnNonDefaultOf = (Option *)0x0;
  pvVar3 = Minisat::Option::getOptionList();
  local_1550 = &local_1650;
  Minisat::vec<Minisat::Option_*>::push(pvVar3,&local_1550);
  local_1650._vptr_Option = (_func_int **)&PTR__Option_00111b68;
  local_1620 = 0x7fffffff00000000;
  local_1618 = 0x7fffffff7fffffff;
  local_16f8._vptr_Option = (_func_int **)&PTR__Option_00111c00;
  local_16f8.name = "drup";
  local_16f8.description = "Generate DRUP UNSAT proof.";
  local_16f8.category = "MAIN";
  local_16f8.type_name = "<bool>";
  local_16f8.dependOnNonDefaultOf = (Option *)0x0;
  pvVar3 = Minisat::Option::getOptionList();
  local_1550 = &local_16f8;
  Minisat::vec<Minisat::Option_*>::push(pvVar3,&local_1550);
  local_16f8._vptr_Option = (_func_int **)&PTR__Option_00111c70;
  local_16c8 = 0;
  Minisat::StringOption::StringOption
            (&local_15d0,"MAIN","drup-file","DRUP UNSAT proof ouput file.","",false,(Option *)0x0);
  Minisat::StringOption::StringOption
            (&local_1590,"MAIN","pcs-file","Print solver parameter configuration to this file.","",
             false,(Option *)0x0);
  Minisat::parseOptions(&local_179c,argv,true);
  if ((local_1590.value != (string *)0x0) && ((local_1590.value)->_M_string_length != 0)) {
    if (local_1590.value == (string *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = ((local_1590.value)->_M_dataplus)._M_p;
    }
    print_pcs_file(pcVar10);
  }
  Minisat::SimpSolver::SimpSolver((SimpSolver *)&local_1550);
  dVar11 = Minisat::cpuTime();
  if ((char)local_1658 == '\0') {
    Minisat::SimpSolver::eliminate(SUB81(&local_1550,0));
  }
  local_157 = 1;
  local_151c = (int)local_15d8;
  local_1528 = (FILE *)0x0;
  if (((char)local_16c8 != '\0') || (*((local_15d0.value)->_M_dataplus)._M_p != '\0')) {
    pFVar4 = _stdout;
    if (*((local_15d0.value)->_M_dataplus)._M_p != '\0') {
      pFVar4 = fopen(((local_15d0.value)->_M_dataplus)._M_p,"wb");
    }
    local_1528 = pFVar4;
    if (pFVar4 == (FILE *)0x0) {
      local_1528 = _stdout;
      if (local_15d0.value == (string *)0x0) {
        pcVar9 = (pointer)0x0;
      }
      else {
        pcVar9 = ((local_15d0.value)->_M_dataplus)._M_p;
      }
      printf("c Error opening %s for write.\n",pcVar9);
    }
    if (local_1528 == _stdout) {
      pcVar10 = "stdout";
    }
    else if (local_15d0.value == (string *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = ((local_15d0.value)->_M_dataplus)._M_p;
    }
    printf("c DRUP proof generation: %s\n",pcVar10);
  }
  solver = (Solver *)&local_1550;
  signal(2,SIGINT_exit);
  signal(0xf,SIGINT_exit);
  signal(0x18,SIGINT_exit);
  if ((int)local_1740 != 0x7fffffff) {
    getrlimit(RLIMIT_CPU,(rlimit *)local_1798);
    if ((pLStack_1790 == (Lit *)0xffffffffffffffff) || ((Lit *)(long)(int)local_1740 < pLStack_1790)
       ) {
      local_1798 = (undefined1  [8])(long)(int)local_1740;
      iVar2 = setrlimit(RLIMIT_CPU,(rlimit *)local_1798);
      if (iVar2 == -1) {
        puts("c WARNING! Could not set resource limit: CPU-time.");
      }
    }
  }
  if ((long)(int)local_1618 != 0x7fffffff) {
    pLVar7 = (Lit *)((long)(int)local_1618 << 0x14);
    getrlimit(RLIMIT_AS,(rlimit *)local_1798);
    if (((pLStack_1790 == (Lit *)0xffffffffffffffff) || (pLVar7 < pLStack_1790)) &&
       (local_1798 = (undefined1  [8])pLVar7, iVar2 = setrlimit(RLIMIT_AS,(rlimit *)local_1798),
       iVar2 == -1)) {
      puts("c WARNING! Could not set resource limit: Virtual memory.");
    }
  }
  if (local_179c == 1) {
    puts("c Reading from standard input... Use \'--help\' for help.");
  }
  pFVar4 = _stdin;
  if (local_179c != 1) {
    pFVar4 = (FILE *)Minisat::open_to_read_file(argv[1]);
  }
  if (pFVar4 == (FILE *)0x0) {
    if (local_179c == 1) {
      pcVar10 = "<stdin>";
    }
    else {
      pcVar10 = argv[1];
    }
    printf("c ERROR! Could not open file: %s\n",pcVar10);
    exit(1);
  }
  if (0 < local_151c) {
    puts("c ============================[ Problem Statistics ]=============================");
    puts("c |                                                                             |");
  }
  Minisat::parse_DIMACS<Minisat::SimpSolver>((FILE *)pFVar4,(SimpSolver *)&local_1550);
  fclose(pFVar4);
  if (local_179c < 3) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    pFVar4 = fopen(argv[2],"wb");
  }
  if (0 < local_151c) {
    printf("c |  Number of variables:  %12d                                         |\n",
           (ulong)local_11d8);
    printf("c |  Number of clauses:    %12d                                         |\n",
           (ulong)local_1318);
  }
  local_1780 = Minisat::cpuTime();
  if (0 < local_151c) {
    printf("c |  Parse time:           %12.2f s                                       |\n",
           local_1780 - dVar11);
  }
  signal(2,default_signal_handler);
  signal(0xf,default_signal_handler);
  signal(0x18,default_signal_handler);
  signal(0xb,default_signal_handler);
  local_157 = 0;
  Minisat::SimpSolver::eliminate(SUB81(&local_1550,0));
  dVar11 = Minisat::cpuTime();
  if (0 < local_151c) {
    printf("c |  Simplification time:  %12.2f s                                       |\n",
           dVar11 - local_1780);
    puts("c |                                                                             |");
  }
  if (local_1328 == '\0') {
    if (pFVar4 != (FILE *)0x0) {
      fwrite("s UNSATISFIABLE\n",0x10,1,pFVar4);
      fclose(pFVar4);
    }
    if (0 < local_151c) {
      puts("c ===============================================================================");
      puts("c Solved by simplification");
      (*(code *)local_1550->category)();
      putchar(10);
    }
    puts("s UNSATISFIABLE");
    if (local_1528 != (FILE *)0x0) {
      local_1798 = (undefined1  [8])0x0;
      pLStack_1790 = (Lit *)0x0;
      Minisat::Solver::binDRUP<Minisat::vec<Minisat::Lit>>
                ((Solver *)&local_1550,'a',(vec<Minisat::Lit> *)local_1798,(FILE *)local_1528);
      if (local_1798 != (undefined1  [8])0x0) {
        pLStack_1790 = (Lit *)((ulong)pLStack_1790 & 0xffffffff00000000);
        free((void *)local_1798);
        local_1798 = (undefined1  [8])0x0;
        pLStack_1790 = (Lit *)((ulong)pLStack_1790 & 0xffffffff);
      }
    }
    if ((local_1528 != (FILE *)0x0) && (local_1528 != _stdout)) {
      fclose(local_1528);
    }
    exit(0x14);
  }
  if ((local_1708 != (long *)0x0) && (*local_1708 != 0)) {
    if (0 < local_151c) {
      puts("c ==============================[ Writing DIMACS ]===============================");
    }
    if (local_1708 == (long *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)*local_1708;
    }
    Minisat::Solver::toDimacs((Solver *)&local_1550,pcVar10);
    if (0 < local_151c) {
      (*(code *)local_1550->category)();
    }
    exit(0);
  }
  local_1798 = (undefined1  [8])0x0;
  pLStack_1790 = (Lit *)0x0;
  Minisat::vec<Minisat::Lit>::copyTo((vec<Minisat::Lit> *)local_1798,local_1190);
  cVar1 = Minisat::SimpSolver::solve_(SUB81(&local_1550,0),true);
  if (0 < local_151c) {
    (*(code *)local_1550->category)();
    putchar(10);
  }
  if (cVar1 == '\0') {
    puts("s SATISFIABLE");
    if ((char)local_1690 == '\x01') {
      printf("v ");
      if (0 < (int)local_11d8) {
        lVar8 = 0;
        do {
          if ((*(byte *)(local_1548 + lVar8) & 2) == 0) {
            pcVar10 = " ";
            if (lVar8 == 0) {
              pcVar10 = "";
            }
            pcVar5 = "";
            if (*(byte *)(local_1548 + lVar8) != 0) {
              pcVar5 = "-";
            }
            printf("%s%s%d",pcVar10,pcVar5,(ulong)((int)lVar8 + 1));
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)local_11d8);
      }
      puts(" 0");
    }
  }
  else {
    pcVar10 = "s UNKNOWN\n";
    if (cVar1 == '\x01') {
      pcVar10 = "s UNSATISFIABLE\n";
    }
    printf(pcVar10);
  }
  if (cVar1 == '\x01' && local_1528 != (FILE *)0x0) {
    fputc(0x61,local_1528);
    fputc(0,local_1528);
  }
  if ((local_1528 != (FILE *)0x0) && (local_1528 != _stdout)) {
    fclose(local_1528);
  }
  if (pFVar4 != (FILE *)0x0) {
    if (cVar1 == '\0') {
      fwrite("s SATISFIABLE\nv ",0x10,1,pFVar4);
      pcVar10 = " 0\n";
      local_1780 = 1.48219693752374e-323;
      if (0 < (int)local_11d8) {
        lVar8 = 0;
        do {
          if ((*(byte *)(local_1548 + lVar8) & 2) == 0) {
            pcVar6 = " ";
            pcVar5 = "";
            if (lVar8 == 0) {
              pcVar6 = "";
            }
            if (*(byte *)(local_1548 + lVar8) != 0) {
              pcVar5 = "-";
            }
            fprintf(pFVar4,"%s%s%d",pcVar6,pcVar5,(ulong)((int)lVar8 + 1));
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)local_11d8);
      }
    }
    else {
      local_1780 = 4.94065645841247e-323;
      if (cVar1 == '\x01') {
        local_1780 = 7.90505033345994e-323;
      }
      pcVar10 = "s UNKNOWN\n";
      if (cVar1 == '\x01') {
        pcVar10 = "s UNSATISFIABLE\n";
      }
    }
    fwrite(pcVar10,(size_t)local_1780,1,pFVar4);
    fclose(pFVar4);
  }
  iVar2 = 0x14;
  if (cVar1 != '\x01') {
    iVar2 = 0;
  }
  __status = 10;
  if (cVar1 != '\0') {
    __status = iVar2;
  }
  exit(__status);
}

Assistant:

int main(int argc, char **argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or "
                     "gzipped DIMACS.\n");
        printf("c This is MergeSAT (simp).\n");

#if defined(__linux__)
        fpu_control_t oldcw, newcw;
        _FPU_GETCW(oldcw);
        newcw = (oldcw & ~_FPU_EXTENDED) | _FPU_DOUBLE;
        _FPU_SETCW(newcw);
        printf("c WARNING: for repeatability, setting FPU to use double precision\n");
#endif
        // Extra options:
        //
        IntOption verb("MAIN", "verb", "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 4), false);
        BoolOption pre("MAIN", "pre", "Completely turn on/off any preprocessing.", true);
        BoolOption s_model("MAIN", "model", "Do report a model if the formula is satisfiable.", true, false);
        StringOption dimacs("MAIN", "dimacs", "If given, stop after preprocessing and write the result to this file.");
        IntOption cpu_lim("MAIN", "cpu-lim", "Limit on CPU time allowed in seconds.\n", INT32_MAX, IntRange(0, INT32_MAX), false);
        IntOption mem_lim("MAIN", "mem-lim", "Limit on memory usage in megabytes.\n", INT32_MAX, IntRange(0, INT32_MAX), false);
        BoolOption drup("MAIN", "drup", "Generate DRUP UNSAT proof.", false, false);
        StringOption drup_file("MAIN", "drup-file", "DRUP UNSAT proof ouput file.", "");
        StringOption pcs_file("MAIN", "pcs-file", "Print solver parameter configuration to this file.", "");

        parseOptions(argc, argv, true);

        if (!pcs_file.is_empty()) print_pcs_file(pcs_file);

        SimpSolver S;
        double initial_time = cpuTime();

        if (!pre) S.eliminate(true);

        S.parsing = true;
        S.verbosity = verb;
        S.drup_file = NULL;
        if (drup || strlen(drup_file)) {
            S.drup_file = strlen(drup_file) ? fopen(drup_file, "wb") : stdout;
            if (S.drup_file == NULL) {
                S.drup_file = stdout;
                printf("c Error opening %s for write.\n", (const char *)drup_file);
            }
            printf("c DRUP proof generation: %s\n", S.drup_file == stdout ? "stdout" : drup_file);
        }

        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        signal(SIGINT, SIGINT_exit);
        signal(SIGTERM, SIGINT_exit);
        signal(SIGXCPU, SIGINT_exit);

        // Set limit on CPU-time:
        if (cpu_lim != INT32_MAX) {
            rlimit rl;
            getrlimit(RLIMIT_CPU, &rl);
            if (rl.rlim_max == RLIM_INFINITY || (rlim_t)cpu_lim < rl.rlim_max) {
                rl.rlim_cur = cpu_lim;
                if (setrlimit(RLIMIT_CPU, &rl) == -1) printf("c WARNING! Could not set resource limit: CPU-time.\n");
            }
        }

        // Set limit on virtual memory:
        if (mem_lim != INT32_MAX) {
            rlim_t new_mem_lim = (rlim_t)mem_lim * 1024 * 1024;
            rlimit rl;
            getrlimit(RLIMIT_AS, &rl);
            if (rl.rlim_max == RLIM_INFINITY || new_mem_lim < rl.rlim_max) {
                rl.rlim_cur = new_mem_lim;
                if (setrlimit(RLIMIT_AS, &rl) == -1)
                    printf("c WARNING! Could not set resource limit: Virtual memory.\n");
            }
        }

        if (argc == 1) printf("c Reading from standard input... Use '--help' for help.\n");

#ifdef USE_LIBZ
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
#else
        FILE *in = (argc == 1) ? stdin : open_to_read_file(argv[1]);
#endif
        if (in == NULL) printf("c ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);

        if (S.verbosity > 0) {
            printf("c ============================[ Problem Statistics ]=============================\n");
            printf("c |                                                                             |\n");
        }

        parse_DIMACS(in, S);
        fclose(in);
        FILE *res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;

        if (S.verbosity > 0) {
            printf("c |  Number of variables:  %12d                                         |\n", S.nVars());
            printf("c |  Number of clauses:    %12d                                         |\n", S.nClauses());
        }

        double parsed_time = cpuTime();
        if (S.verbosity > 0)
            printf("c |  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);

        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        signal(SIGINT, default_signal_handler);
        signal(SIGTERM, default_signal_handler);
        signal(SIGXCPU, default_signal_handler);
        signal(SIGSEGV, default_signal_handler); /* we still want to understand the state */

        S.parsing = false;
        S.eliminate(true);
        double simplified_time = cpuTime();
        if (S.verbosity > 0) {
            printf("c |  Simplification time:  %12.2f s                                       |\n", simplified_time - parsed_time);
            printf("c |                                                                             |\n");
        }

        if (!S.okay()) {
            if (res != NULL) fprintf(res, "s UNSATISFIABLE\n"), fclose(res);
            if (S.verbosity > 0) {
                printf("c ===============================================================================\n");
                printf("c Solved by simplification\n");
                printStats(S);
                printf("\n");
            }
            printf("s UNSATISFIABLE\n");
            if (S.drup_file) {
#ifdef BIN_DRUP
                S.binDRUP('a', vec<Lit>(), S.drup_file);
#else
                fprintf(S.drup_file, "0\n");
#endif
            }
            if (S.drup_file && S.drup_file != stdout) fclose(S.drup_file);
            exit(20);
        }

        if (dimacs) {
            if (S.verbosity > 0)
                printf("c ==============================[ Writing DIMACS ]===============================\n");
            S.toDimacs((const char *)dimacs);
            if (S.verbosity > 0) printStats(S);
            exit(0);
        }

        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);

        if (S.verbosity > 0) {
            printStats(S);
            printf("\n");
        }
        printf(ret == l_True ? "s SATISFIABLE\n" : ret == l_False ? "s UNSATISFIABLE\n" : "s UNKNOWN\n");
        if (ret == l_True && s_model) {
            printf("v ");
            for (int i = 0; i < S.nVars(); i++)
                if (S.model[i] != l_Undef)
                    printf("%s%s%d", (i == 0) ? "" : " ", (S.model[i] == l_True) ? "" : "-", i + 1);
            printf(" 0\n");
        }


        if (S.drup_file && ret == l_False) {
#ifdef BIN_DRUP
            fputc('a', S.drup_file);
            fputc(0, S.drup_file);
#else
            fprintf(S.drup_file, "0\n");
#endif
        }
        if (S.drup_file && S.drup_file != stdout) fclose(S.drup_file);

        if (res != NULL) {
            if (ret == l_True) {
                fprintf(res, "s SATISFIABLE\nv ");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i == 0) ? "" : " ", (S.model[i] == l_True) ? "" : "-", i + 1);
                fprintf(res, " 0\n");
            } else if (ret == l_False)
                fprintf(res, "s UNSATISFIABLE\n");
            else
                fprintf(res, "s UNKNOWN\n");
            fclose(res);
        }

#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0); // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException &) {
        printf("c ===============================================================================\n");
        printf("c Out of memory\n");
        printf("s UNKNOWN\n");
        exit(0);
    }
}